

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileWatcher.cpp
# Opt level: O2

void __thiscall wmj::fileWatcher::fileWatcher::~fileWatcher(fileWatcher *this)

{
  ~fileWatcher(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

fileWatcher::~fileWatcher() {
    need_watching = false;
    startWatch();
    stopWatch();
}